

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O1

ReferenceCounterValueType __thiscall
Diligent::RenderDeviceBase<Diligent::SerializationEngineImplTraits>::Release
          (RenderDeviceBase<Diligent::SerializationEngineImplTraits> *this)

{
  ReferenceCounterValueType RVar1;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  if ((this->super_ObjectBase<Diligent::ISerializationDevice>).
      super_RefCountedObject<Diligent::ISerializationDevice>.m_pRefCounters ==
      (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Release",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
               ,0x229);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  RVar1 = RefCountersImpl::
          ReleaseStrongRef<Diligent::RefCountersImpl::ReleaseStrongRef()::_lambda()_1_>
                    ((this->super_ObjectBase<Diligent::ISerializationDevice>).
                     super_RefCountedObject<Diligent::ISerializationDevice>.m_pRefCounters,
                     (anon_class_1_0_00000001 *)&local_30);
  return RVar1;
}

Assistant:

Release() override final
    {
        return TObjectBase::Release();
    }